

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImVector_ImDrawVert * ImVector_ImDrawVert_ImVector_ImDrawVertVector(ImVector_ImDrawVert *src)

{
  ImVector<ImDrawVert> *this;
  ImVector_ImDrawVert *src_local;
  
  ImGui::MemAlloc(0x10);
  this = (ImVector<ImDrawVert> *)operator_new(0x10);
  ImVector<ImDrawVert>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImDrawVert* ImVector_ImDrawVert_ImVector_ImDrawVertVector(const ImVector_ImDrawVert src)
{
    return IM_NEW(ImVector_ImDrawVert)(src);
}